

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int numberOfCachePages(PCache *p)

{
  int iVar1;
  
  iVar1 = p->szCache;
  if (-1 < (long)iVar1) {
    return iVar1;
  }
  return (int)(((long)iVar1 * -0x400) / ((long)p->szExtra + (long)p->szPage));
}

Assistant:

static int numberOfCachePages(PCache *p){
  if( p->szCache>=0 ){
    /* IMPLEMENTATION-OF: R-42059-47211 If the argument N is positive then the
    ** suggested cache size is set to N. */
    return p->szCache;
  }else{
    /* IMPLEMENTATION-OF: R-61436-13639 If the argument N is negative, then
    ** the number of cache pages is adjusted to use approximately abs(N*1024)
    ** bytes of memory. */
    return (int)((-1024*(i64)p->szCache)/(p->szPage+p->szExtra));
  }
}